

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

void push_path(h2o_req_t *src_req,char *abspath,size_t abspath_len)

{
  h2o_http2_conn_t *conn_00;
  h2o_token_t *token_00;
  int iVar1;
  h2o_cache_digests_state_t hVar2;
  ssize_t sVar3;
  h2o_mem_pool_t *pool;
  long lVar4;
  h2o_http2_stream_t *stream_00;
  undefined8 *puVar5;
  h2o_iovec_t hVar6;
  char *local_f0;
  h2o_token_t *token;
  h2o_header_t *src_header;
  size_t i;
  size_t local_c0;
  char *local_b8;
  size_t local_b0;
  h2o_http2_stream_t *stream;
  h2o_header_t *header;
  ssize_t header_index;
  size_t local_78;
  h2o_iovec_t local_70;
  undefined8 local_60;
  undefined8 local_58;
  h2o_iovec_t local_50;
  undefined1 local_40 [8];
  h2o_iovec_t url;
  h2o_http2_stream_t *src_stream;
  h2o_http2_conn_t *conn;
  size_t abspath_len_local;
  char *abspath_local;
  h2o_req_t *src_req_local;
  
  conn_00 = (h2o_http2_conn_t *)src_req->conn;
  url.len = (size_t)&src_req[-1].res;
  iVar1 = h2o_http2_stream_is_push(((h2o_res_t *)url.len)->status);
  if (((((iVar1 == 0) && ((*(byte *)(*(long *)(url.len + 0x158) + 200) >> 1 & 1) != 0)) &&
       ((conn_00->peer_settings).enable_push != 0)) &&
      (((conn_00->num_streams).push.open < (conn_00->peer_settings).max_concurrent_streams &&
       ((conn_00->push_stream_ids).max_open < 0x7ffffff0)))) &&
     ((iVar1 = h2o_linklist_is_empty(&conn_00->_pending_reqs), iVar1 != 0 &&
      ((iVar1 = can_run_requests(conn_00), iVar1 != 0 &&
       (sVar3 = h2o_find_header((h2o_headers_t *)(url.len + 0x1e0),h2o__tokens + 0x3b,-1),
       sVar3 == -1)))))) {
    if (*(long *)(url.len + 0x88) != 0) {
      pool = (h2o_mem_pool_t *)(url.len + 0x350);
      header_index = **(ssize_t **)(url.len + 0x118);
      local_78 = (*(ssize_t **)(url.len + 0x118))[1];
      local_70 = h2o_iovec_init("://",3);
      local_60 = *(undefined8 *)(url.len + 0x120);
      local_58 = *(undefined8 *)(url.len + 0x128);
      local_50 = h2o_iovec_init(abspath,abspath_len);
      _local_40 = h2o_concat_list(pool,(h2o_iovec_t *)&header_index,4);
      hVar2 = h2o_cache_digests_lookup_by_url
                        (*(h2o_cache_digests_t **)(url.len + 0x88),(char *)local_40,(size_t)url.base
                        );
      if (hVar2 == H2O_CACHE_DIGESTS_STATE_FRESH) {
        return;
      }
    }
    if ((*(int *)(*(long *)(url.len + 0x158) + 0xcc) != 0) && ((*(byte *)(url.len + 0x90) & 1) == 0)
       ) {
      *(byte *)(url.len + 0x90) = *(byte *)(url.len + 0x90) & 0xfe | 1;
      if (conn_00->casper == (h2o_http2_casper_t *)0x0) {
        h2o_http2_conn_init_casper(conn_00,*(uint *)(*(long *)(url.len + 0x158) + 0xcc));
      }
      header = (h2o_header_t *)0xffffffffffffffff;
      while (header = (h2o_header_t *)
                      h2o_find_header((h2o_headers_t *)(url.len + 0x1e0),h2o__tokens + 0x18,
                                      (ssize_t)header), header != (h2o_header_t *)0xffffffffffffffff
            ) {
        lVar4 = *(long *)(url.len + 0x1e0) + (long)header * 0x20;
        h2o_http2_casper_consume_cookie
                  (conn_00->casper,*(char **)(lVar4 + 0x10),*(size_t *)(lVar4 + 0x18));
      }
    }
    iVar1 = update_push_memo(conn_00,(h2o_req_t *)(url.len + 0x110),abspath,abspath_len);
    if (iVar1 == 0) {
      stream_00 = h2o_http2_stream_open
                            (conn_00,(conn_00->push_stream_ids).max_open + 2,(h2o_req_t *)0x0,
                             &h2o_http2_default_priority);
      (stream_00->received_priority).dependency = *(uint32_t *)url.len;
      (stream_00->field_12).push.parent_stream_id = *(uint32_t *)url.len;
      h2o_http2_scheduler_open
                (&(stream_00->_refs).scheduler,(h2o_http2_scheduler_node_t *)(url.len + 0xa8),0x10,0
                );
      h2o_http2_stream_prepare_for_request(conn_00,stream_00);
      (stream_00->req).input.method.base = "GET";
      (stream_00->req).input.method.len = 3;
      (stream_00->req).input.scheme = *(h2o_url_scheme_t **)(url.len + 0x118);
      hVar6 = h2o_strdup(&(stream_00->req).pool,*(char **)(url.len + 0x120),
                         *(size_t *)(url.len + 0x128));
      local_b8 = hVar6.base;
      (stream_00->req).input.authority.base = local_b8;
      local_b0 = hVar6.len;
      (stream_00->req).input.authority.len = local_b0;
      hVar6 = h2o_strdup(&(stream_00->req).pool,abspath,abspath_len);
      i = (size_t)hVar6.base;
      (stream_00->req).input.path.base = (char *)i;
      local_c0 = hVar6.len;
      (stream_00->req).input.path.len = local_c0;
      (stream_00->req).version = 0x200;
      for (src_header = (h2o_header_t *)0x0; src_header != *(h2o_header_t **)(url.len + 0x1e8);
          src_header = (h2o_header_t *)((long)&src_header->name + 1)) {
        puVar5 = (undefined8 *)(*(long *)(url.len + 0x1e0) + (long)src_header * 0x20);
        iVar1 = h2o_iovec_is_token((h2o_iovec_t *)*puVar5);
        if ((iVar1 != 0) &&
           (token_00 = (h2o_token_t *)*puVar5, ((byte)token_00->field_0x11 >> 4 & 1) != 0)) {
          hVar6 = h2o_strdup(&(stream_00->req).pool,(char *)puVar5[2],puVar5[3]);
          local_f0 = hVar6.base;
          h2o_add_header(&(stream_00->req).pool,&(stream_00->req).headers,token_00,(char *)0x0,
                         local_f0,puVar5[3]);
        }
      }
      execute_or_enqueue_request(conn_00,stream_00);
      if ((((ulong)stream_00->field_12 & 0x100000000) == 0) &&
         (stream_00->state != H2O_HTTP2_STREAM_STATE_END_STREAM)) {
        h2o_http2_stream_send_push_promise(conn_00,stream_00);
      }
    }
  }
  return;
}

Assistant:

static void push_path(h2o_req_t *src_req, const char *abspath, size_t abspath_len)
{
    h2o_http2_conn_t *conn = (void *)src_req->conn;
    h2o_http2_stream_t *src_stream = H2O_STRUCT_FROM_MEMBER(h2o_http2_stream_t, req, src_req);

    /* RFC 7540 8.2.1: PUSH_PROMISE frames can be sent by the server in response to any client-initiated stream */
    if (h2o_http2_stream_is_push(src_stream->stream_id))
        return;

    if (!src_stream->req.hostconf->http2.push_preload || !conn->peer_settings.enable_push ||
        conn->num_streams.push.open >= conn->peer_settings.max_concurrent_streams)
        return;

    if (conn->push_stream_ids.max_open >= 0x7ffffff0)
        return;
    if (!(h2o_linklist_is_empty(&conn->_pending_reqs) && can_run_requests(conn)))
        return;

    if (h2o_find_header(&src_stream->req.headers, H2O_TOKEN_X_FORWARDED_FOR, -1) != -1)
        return;

    if (src_stream->cache_digests != NULL) {
        h2o_iovec_t url = h2o_concat(&src_stream->req.pool, src_stream->req.input.scheme->name, h2o_iovec_init(H2O_STRLIT("://")),
                                     src_stream->req.input.authority, h2o_iovec_init(abspath, abspath_len));
        if (h2o_cache_digests_lookup_by_url(src_stream->cache_digests, url.base, url.len) == H2O_CACHE_DIGESTS_STATE_FRESH)
            return;
    }

    /* delayed initialization of casper (cookie-based), that MAY be used together to cache-digests */
    if (src_stream->req.hostconf->http2.casper.capacity_bits != 0) {
        if (!src_stream->pull.casper_is_ready) {
            src_stream->pull.casper_is_ready = 1;
            if (conn->casper == NULL)
                h2o_http2_conn_init_casper(conn, src_stream->req.hostconf->http2.casper.capacity_bits);
            ssize_t header_index;
            for (header_index = -1;
                 (header_index = h2o_find_header(&src_stream->req.headers, H2O_TOKEN_COOKIE, header_index)) != -1;) {
                h2o_header_t *header = src_stream->req.headers.entries + header_index;
                h2o_http2_casper_consume_cookie(conn->casper, header->value.base, header->value.len);
            }
        }
    }

    /* update the push memo, and if it already pushed on the same connection, return */
    if (update_push_memo(conn, &src_stream->req, abspath, abspath_len))
        return;

    /* open the stream */
    h2o_http2_stream_t *stream = h2o_http2_stream_open(conn, conn->push_stream_ids.max_open + 2, NULL, &h2o_http2_default_priority);
    stream->received_priority.dependency = src_stream->stream_id;
    stream->push.parent_stream_id = src_stream->stream_id;
    h2o_http2_scheduler_open(&stream->_refs.scheduler, &src_stream->_refs.scheduler.node, 16, 0);
    h2o_http2_stream_prepare_for_request(conn, stream);

    /* setup request */
    stream->req.input.method = (h2o_iovec_t){H2O_STRLIT("GET")};
    stream->req.input.scheme = src_stream->req.input.scheme;
    stream->req.input.authority =
        h2o_strdup(&stream->req.pool, src_stream->req.input.authority.base, src_stream->req.input.authority.len);
    stream->req.input.path = h2o_strdup(&stream->req.pool, abspath, abspath_len);
    stream->req.version = 0x200;

    { /* copy headers that may affect the response (of a cacheable response) */
        size_t i;
        for (i = 0; i != src_stream->req.headers.size; ++i) {
            h2o_header_t *src_header = src_stream->req.headers.entries + i;
            if (h2o_iovec_is_token(src_header->name)) {
                h2o_token_t *token = H2O_STRUCT_FROM_MEMBER(h2o_token_t, buf, src_header->name);
                if (token->copy_for_push_request) {
                    h2o_add_header(&stream->req.pool, &stream->req.headers, token, NULL,
                                   h2o_strdup(&stream->req.pool, src_header->value.base, src_header->value.len).base,
                                   src_header->value.len);
                }
            }
        }
    }

    execute_or_enqueue_request(conn, stream);

    /* send push-promise ASAP (before the parent stream gets closed), even if execute_or_enqueue_request did not trigger the
     * invocation of send_headers */
    if (!stream->push.promise_sent && stream->state != H2O_HTTP2_STREAM_STATE_END_STREAM)
        h2o_http2_stream_send_push_promise(conn, stream);
}